

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_and_snapshot_test(void)

{
  fdb_status fVar1;
  size_t vallen;
  void *val;
  int r;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_status status;
  fdb_kvs_info kvs_info;
  fdb_seqnum_t rollback_seqnum;
  fdb_seqnum_t seqnum;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffd18;
  size_t *in_stack_fffffffffffffd38;
  void **in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  void *in_stack_fffffffffffffd50;
  fdb_kvs_handle *in_stack_fffffffffffffd58;
  fdb_seqnum_t in_stack_fffffffffffffe40;
  fdb_kvs_handle **in_stack_fffffffffffffe48;
  undefined1 local_190 [16];
  fdb_kvs_info *in_stack_fffffffffffffe80;
  fdb_kvs_handle *in_stack_fffffffffffffe88;
  fdb_kvs_config *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  fdb_kvs_handle **in_stack_fffffffffffffed0;
  fdb_file_handle *in_stack_fffffffffffffed8;
  fdb_config *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  fdb_file_handle **in_stack_ffffffffffffff48;
  fdb_seqnum_t in_stack_ffffffffffffffc0;
  fdb_kvs_handle **in_stack_ffffffffffffffc8;
  fdb_kvs_handle *handle_in;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_190,&stack0xfffffffffffffd40,0xf8);
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  handle_in = (fdb_kvs_handle *)local_10.tv_sec;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb48);
    rollback_and_snapshot_test::__test_pass = 0;
    handle_in = (fdb_kvs_handle *)local_10.tv_sec;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb48,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8
                       ,in_stack_fffffffffffffec0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb4a);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb4a,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_set_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb4e);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb4e,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffd18,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb50);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb50,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb53);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb53,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_set_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb57);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb57,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffd18,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb59);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb59,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb5c);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb5c,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_set_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb64);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb64,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffd18,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb66);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb66,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb69);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb69,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb6d);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb6d,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb70);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb70,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb77);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb77,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_snapshot_open(handle_in,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb7b);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb7b,"void rollback_and_snapshot_test()");
    }
  }
  fVar1 = fdb_get_kv(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xb7f);
    rollback_and_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xb7f,"void rollback_and_snapshot_test()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffd18);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffd18);
  fdb_shutdown();
  memleak_end();
  if (rollback_and_snapshot_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","rollback and snapshot test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","rollback and snapshot test");
  }
  return;
}

Assistant:

void rollback_and_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    fdb_seqnum_t seqnum, rollback_seqnum;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db,  *snapshot;
    int r;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // MB-12530 open db
    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "mvcc_test", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 2. Create Key 'a' and Commit
    status = fdb_set_kv(db, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 3. Create Key 'b' and Commit
    status = fdb_set_kv(db, (void *)"b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 4.  Remember this as our rollback point
    rollback_seqnum = seqnum;

    // 5. Create Key 'c' and Commit
    status = fdb_set_kv(db, (void *)"c", 1,(void *) "val-c", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 6. Rollback to rollback point (seq 2)
    status = fdb_rollback(&db, rollback_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 7. Verify that Key 'c' is not found
    void *val;
    size_t vallen;
    status = fdb_get_kv(db, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // 8. Open a snapshot at the same point
    status = fdb_snapshot_open(db, &snapshot, seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 9. Verify that Key 'c' is not found
    status = fdb_get_kv(snapshot, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // close the snapshot db
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("rollback and snapshot test");
}